

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_comp.c
# Opt level: O1

int avl_comp_int32(void *k1,void *k2)

{
  int iVar1;
  
  iVar1 = 1;
  if (*k1 <= *k2) {
    iVar1 = -(uint)(*k1 < *k2);
  }
  return iVar1;
}

Assistant:

int
avl_comp_int32(const void *k1, const void *k2) {
  const int32_t *i1 = k1;
  const int32_t *i2 = k2;

  if (*i1 > *i2) {
    return 1;
  }
  if (*i2 > *i1) {
    return -1;
  }
  return 0;
}